

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O1

void Am_Widget_General_Undo_Redo(Am_Object *command_obj,bool undo,bool selective)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object widget;
  Am_Object inter;
  Am_Value old_value;
  Am_Value new_value;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  Am_Value local_30;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  local_50.data = (Am_Object_Data *)0x0;
  local_58.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_50,pAVar2);
  bVar1 = Am_Object::Valid(&local_50);
  if (bVar1) {
    Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_50,10);
    Am_Object::operator=(&local_58,&local_48);
    Am_Object::~Am_Object(&local_48);
  }
  this = command_obj;
  if (selective) {
    bVar1 = Am_Object::Valid(&local_58);
    this = &local_58;
    if (!bVar1) goto LAB_0023161f;
  }
  pAVar2 = Am_Object::Get(this,0x169,1);
  Am_Value::operator=(&local_30,pAVar2);
LAB_0023161f:
  pAVar2 = Am_Object::Get(command_obj,(ushort)undo + (ushort)undo * 2 + 0x169,1);
  Am_Value::operator=(&local_40,pAVar2);
  Am_Object::Set(command_obj,0x16c,&local_30,0);
  Am_Object::Set(command_obj,0x169,&local_40,0);
  bVar1 = Am_Object::Valid(&local_58);
  if (bVar1) {
    Am_Object::Set(&local_58,0x16c,&local_30,1);
    Am_Object::Set(&local_58,0x169,&local_40,0);
  }
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  Am_Value::~Am_Value(&local_40);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void
Am_Widget_General_Undo_Redo(Am_Object command_obj, bool undo, bool selective)
{
  Am_Value new_value, old_value;
  Am_Object inter, widget;
  // this command was in the inter in the widget.  The SAVED_OLD_OWNER
  // will be the inter.  Want to actually set the widget.  The
  // old_value in the command object is for the widget, not for the
  // interactor.  The interactor's value is reset by impl_command.
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  if (inter.Valid())
    widget = inter.Get_Owner();

  if (selective) { // then get current value from the interactor
    if (widget.Valid())
      new_value = widget.Peek(Am_VALUE);
  } else // get current value from the command_obj
    new_value = command_obj.Peek(Am_VALUE);

  if (undo)
    old_value = command_obj.Peek(Am_OLD_VALUE);
  else // repeat
    old_value = command_obj.Peek(Am_VALUE);

  command_obj.Set(Am_OLD_VALUE, new_value);
  command_obj.Set(Am_VALUE, old_value);
  //also set widget
  if (widget.Valid()) {
#ifdef DEBUG
    if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING)) {
      std::cout << "++ ";
      if (selective)
        std::cout << "selective ";
      if (undo)
        std::cout << "undo ";
      else
        std::cout << "repeat ";
      std::cout << "setting the Am_VALUE of " << widget << " to " << old_value
                << std::endl
                << std::flush;
    }
#endif
    widget.Set(Am_OLD_VALUE, new_value, Am_OK_IF_NOT_THERE);
    widget.Set(Am_VALUE, old_value);
  }
}